

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O1

void update_shared_ptr(shared_ptr<TestBaseType> *ptr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  TestBaseType *__tmp;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xc0);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00175c28;
  memset((element_type *)(p_Var1 + 1),0,0xb0);
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TestBaseType_00175d00;
  p_Var1[1]._M_use_count = 10;
  p_Var1[1]._M_weak_count = 0xf;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)&p_Var1[1]._M_weak_count;
  memset(&p_Var1[2]._M_use_count,0,0x98);
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TestBaseType_00175cd8;
  (ptr->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var1 + 1);
  this = (ptr->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (ptr->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var1;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    return;
  }
  return;
}

Assistant:

void update_shared_ptr(std::shared_ptr<TestBaseType> &ptr) {
  ptr = std::make_shared<TestDerivedType>();
}